

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase36::run(TestCase36 *this)

{
  bool local_82;
  bool local_81;
  bool _kj_shouldLog_1;
  Type TStack_80;
  bool _kj_shouldLog;
  undefined1 local_78 [8];
  Promise<void> promise;
  bool done;
  undefined1 local_58 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase36 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.busyPollInterval);
  WaitScope::WaitScope((WaitScope *)local_58,(EventLoop *)&waitScope.busyPollInterval);
  promise.super_PromiseBase.node.ptr._3_1_ = 0;
  TStack_80.done = (bool *)((long)&promise.super_PromiseBase.node.ptr + 3);
  evalLater<kj::(anonymous_namespace)::TestCase36::run()::__0>
            ((kj *)local_78,&stack0xffffffffffffff80);
  if ((promise.super_PromiseBase.node.ptr._3_1_ & 1) != 0) {
    local_81 = _::Debug::shouldLog(ERROR);
    while (local_81 != false) {
      _::Debug::log<char_const(&)[25]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2b,ERROR,"\"failed: expected \" \"!(done)\"",
                 (char (*) [25])"failed: expected !(done)");
      local_81 = false;
    }
  }
  Promise<void>::wait((Promise<void> *)local_78,local_58);
  if ((promise.super_PromiseBase.node.ptr._3_1_ & 1) == 0) {
    local_82 = _::Debug::shouldLog(ERROR);
    while (local_82 != false) {
      _::Debug::log<char_const(&)[22]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x2d,ERROR,"\"failed: expected \" \"done\"",(char (*) [22])"failed: expected done"
                );
      local_82 = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)local_78);
  WaitScope::~WaitScope((WaitScope *)local_58);
  EventLoop::~EventLoop((EventLoop *)&waitScope.busyPollInterval);
  return;
}

Assistant:

TEST(Async, EvalVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  bool done = false;

  Promise<void> promise = evalLater([&]() { done = true; });
  EXPECT_FALSE(done);
  promise.wait(waitScope);
  EXPECT_TRUE(done);
}